

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RazorAHRS.cpp
# Opt level: O1

void * RazorAHRSThread(void *pParam)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  size_t sVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  char *pcVar14;
  char *__s;
  RAZORAHRSDATA razorahrsdata;
  CHRONO chrono_period;
  char szTemp [256];
  RAZORAHRS razorahrs;
  char szSaveFilePath [256];
  double local_a18;
  double local_a10;
  interval local_a08;
  int local_9f0;
  int local_9ec;
  RAZORAHRSDATA local_9e8;
  timespec local_980;
  double local_970;
  double dStack_968;
  double local_960;
  double dStack_958;
  timespec local_950;
  int local_940;
  timeval local_938;
  interval local_928;
  interval local_910;
  char local_8f8 [256];
  RAZORAHRS local_7f8;
  char local_138 [264];
  
  memset(&local_7f8,0,0x6c0);
  local_938.tv_sec = 0;
  local_938.tv_usec = 0;
  local_9e8.yaw = 0.0;
  local_9e8.pitch = 0.0;
  local_9e8.roll = 0.0;
  local_9e8.accx = 0.0;
  local_9e8.accy = 0.0;
  local_9e8.accz = 0.0;
  local_9e8.gyrx = 0.0;
  local_9e8.gyry = 0.0;
  local_9e8.gyrz = 0.0;
  local_9e8.Roll = 0.0;
  local_9e8.Pitch = 0.0;
  local_9e8.Yaw = 0.0;
  iVar4 = clock_getres(4,&local_950);
  if ((iVar4 == 0) && (iVar4 = clock_gettime(4,&local_980), iVar4 == 0)) {
    local_940 = 0;
    local_970 = 0.0;
    dStack_968 = 0.0;
    local_960 = 0.0;
    dStack_958 = 0.0;
  }
  iVar4 = 0x32;
  __s = "RazorAHRS disconnection failed.";
  bVar2 = false;
  local_9f0 = 0;
  do {
    local_9ec = iVar4;
    while( true ) {
      if (local_940 == 0) {
        clock_gettime(4,(timespec *)&local_a08);
        local_970 = local_a08.inf;
        dStack_968 = local_a08.sup;
        local_a08.inf =
             (double)(((long)local_a08.inf + (long)local_960 +
                      ((long)local_a08.sup + (long)dStack_958) / 1000000000) - local_980.tv_sec);
        local_a08.sup =
             (double)(((long)local_a08.sup + (long)dStack_958) % 1000000000 - local_980.tv_nsec);
        if ((long)local_a08.sup < 0) {
          local_a08.inf = (double)((long)local_a08.inf + (long)local_a08.sup / 1000000000 + -1);
          local_a08.sup = (double)((long)local_a08.sup % 1000000000 + 1000000000);
        }
        local_960 = local_a08.inf;
        dStack_958 = local_a08.sup;
      }
      iVar5 = clock_getres(4,&local_950);
      if ((iVar5 == 0) && (iVar5 = clock_gettime(4,&local_980), iVar5 == 0)) {
        local_940 = 0;
        local_960 = 0.0;
        dStack_958 = 0.0;
        local_970 = 0.0;
        dStack_968 = 0.0;
      }
      local_a08.inf = (double)((long)iVar4 / 1000);
      local_a08.sup = (double)(((long)iVar4 % 1000) * 1000000);
      nanosleep((timespec *)&local_a08,(timespec *)0x0);
      iVar5 = local_9ec;
      if (bPauseRazorAHRS == 0) break;
      if (bVar2) {
        puts("RazorAHRS paused.");
        iVar5 = CloseRS232Port(&local_7f8.RS232Port);
        pcVar14 = "RazorAHRS disconnection failed.";
        if (iVar5 == 0) {
          pcVar14 = "RazorAHRS disconnected.";
        }
        puts(pcVar14);
      }
      if (bExit != 0) {
        bVar3 = true;
        goto LAB_00155af6;
      }
      local_a08.inf = 0.0;
      local_a08.sup = 4.94065645841247e-316;
      bVar2 = false;
      nanosleep((timespec *)&local_a08,(timespec *)0x0);
    }
    if (bRestartRazorAHRS != 0) {
      if (bVar2) {
        puts("Restarting a RazorAHRS.");
        iVar4 = CloseRS232Port(&local_7f8.RS232Port);
        pcVar14 = "RazorAHRS disconnection failed.";
        if (iVar4 == 0) {
          pcVar14 = "RazorAHRS disconnected.";
        }
        puts(pcVar14);
      }
      bRestartRazorAHRS = 0;
      bVar2 = false;
    }
    if (bVar2) {
      iVar4 = GetLatestDataRazorAHRS(&local_7f8,&local_9e8);
      if (iVar4 == 0) {
        iVar4 = gettimeofday(&local_938,(__timezone_ptr_t)0x0);
        if (iVar4 != 0) {
          local_938.tv_sec = 0;
          local_938.tv_usec = 0;
        }
        pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
        dVar1 = fmod(local_9e8.Roll,6.283185307179586);
        local_a18 = fmod(dVar1 + 9.42477796076938,6.283185307179586);
        local_a18 = local_a18 + -3.141592653589793;
        interval::interval(&local_928,&local_a18);
        local_a10 = -phi_ahrs_acc;
        interval::interval(&local_910,&local_a10,&phi_ahrs_acc);
        operator+(&local_928,&local_910);
        interval::operator=((interval *)&phi_ahrs,&local_a08);
        dVar1 = fmod(-local_9e8.Pitch,6.283185307179586);
        local_a18 = fmod(dVar1 + 9.42477796076938,6.283185307179586);
        local_a18 = local_a18 + -3.141592653589793;
        interval::interval(&local_928,&local_a18);
        local_a10 = -theta_ahrs_acc;
        interval::interval(&local_910,&local_a10,&theta_ahrs_acc);
        operator+(&local_928,&local_910);
        interval::operator=((interval *)&theta_ahrs,&local_a08);
        dVar1 = fmod((1.5707963267948966 - local_9e8.Yaw) - angle_env,6.283185307179586);
        local_a18 = fmod(dVar1 + 9.42477796076938,6.283185307179586);
        local_a18 = local_a18 + -3.141592653589793;
        interval::interval(&local_928,&local_a18);
        local_a10 = -psi_ahrs_acc;
        interval::interval(&local_910,&local_a10,&psi_ahrs_acc);
        operator+(&local_928,&local_910);
        interval::operator=((interval *)&psi_ahrs,&local_a08);
        if ((local_7f8.bROSMode != 0) &&
           ((((((local_9e8.gyrx != 0.0 || (NAN(local_9e8.gyrx))) || (local_9e8.gyry != 0.0)) ||
              (((NAN(local_9e8.gyry) || (local_9e8.gyrz != 0.0)) ||
               ((NAN(local_9e8.gyrz) || ((local_9e8.accx != 0.0 || (NAN(local_9e8.accx))))))))) ||
             (local_9e8.accy != 0.0)) ||
            (((NAN(local_9e8.accy) || (local_9e8.accz != 0.0)) || (NAN(local_9e8.accz))))))) {
          interval::interval(&local_928,&local_9e8.gyrx);
          local_a18 = -omegax_ahrs_acc;
          interval::interval(&local_910,&local_a18,&omegax_ahrs_acc);
          operator+(&local_928,&local_910);
          interval::operator=((interval *)&omegax_ahrs,&local_a08);
          local_a18 = -local_9e8.gyry;
          interval::interval(&local_928,&local_a18);
          local_a10 = -omegay_ahrs_acc;
          interval::interval(&local_910,&local_a10,&omegay_ahrs_acc);
          operator+(&local_928,&local_910);
          interval::operator=((interval *)&omegay_ahrs,&local_a08);
          local_a18 = -local_9e8.gyrz;
          interval::interval(&local_928,&local_a18);
          local_a10 = -omegaz_ahrs_acc;
          interval::interval(&local_910,&local_a10,&omegaz_ahrs_acc);
          operator+(&local_928,&local_910);
          interval::operator=((interval *)&omegaz_ahrs,&local_a08);
          local_a18 = local_9e8.accx * 9.8 * 0.00390625;
          interval::interval(&local_928,&local_a18);
          local_a10 = -accrx_ahrs_acc;
          interval::interval(&local_910,&local_a10,&accrx_ahrs_acc);
          operator+(&local_928,&local_910);
          interval::operator=((interval *)&accrx_ahrs,&local_a08);
          local_a18 = local_9e8.accy * -9.8 * 0.00390625;
          interval::interval(&local_928,&local_a18);
          local_a10 = -accry_ahrs_acc;
          interval::interval(&local_910,&local_a10,&accry_ahrs_acc);
          operator+(&local_928,&local_910);
          interval::operator=((interval *)&accry_ahrs,&local_a08);
          local_a18 = local_9e8.accz * -9.8 * 0.00390625;
          interval::interval(&local_928,&local_a18);
          local_a10 = -accrz_ahrs_acc;
          interval::interval(&local_910,&local_a10,&accrz_ahrs_acc);
          operator+(&local_928,&local_910);
          interval::operator=((interval *)&accrz_ahrs,&local_a08);
        }
        pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
        bVar2 = true;
        bVar3 = false;
        iVar4 = iVar5;
      }
      else {
        puts("Connection to a RazorAHRS lost.");
        iVar4 = CloseRS232Port(&local_7f8.RS232Port);
        if (iVar4 == 0) {
          pcVar14 = "RazorAHRS disconnected.";
        }
        else {
          pcVar14 = "RazorAHRS disconnection failed.";
        }
        puts(pcVar14);
LAB_001558df:
        bVar2 = false;
        bVar3 = true;
        iVar4 = iVar5;
      }
    }
    else {
      iVar6 = ConnectRazorAHRS(&local_7f8,"RazorAHRS0.txt");
      iVar4 = local_7f8.threadperiod;
      if (iVar6 != 0) {
        local_a08.inf = 4.94065645841247e-324;
        local_a08.sup = 0.0;
        nanosleep((timespec *)&local_a08,(timespec *)0x0);
        goto LAB_001558df;
      }
      local_938.tv_sec = 0;
      local_938.tv_usec = 0;
      local_9e8.yaw = 0.0;
      local_9e8.pitch = 0.0;
      local_9e8.roll = 0.0;
      local_9e8.accx = 0.0;
      local_9e8.accy = 0.0;
      local_9e8.accz = 0.0;
      local_9e8.gyrx = 0.0;
      local_9e8.gyry = 0.0;
      local_9e8.gyrz = 0.0;
      local_9e8.Roll = 0.0;
      local_9e8.Pitch = 0.0;
      local_9e8.Yaw = 0.0;
      if ((FILE *)local_7f8.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)local_7f8.pfSaveFile);
        local_7f8.pfSaveFile = (FILE *)0x0;
      }
      bVar3 = false;
      bVar2 = true;
      if ((local_7f8.bSaveRawData != 0) && ((FILE *)local_7f8.pfSaveFile == (FILE *)0x0)) {
        if (local_7f8.szCfgFilePath[0] == '\0') {
          builtin_strncpy(local_8f8,"razorahrs",10);
        }
        else {
          sprintf(local_8f8,"%.127s",local_7f8.szCfgFilePath);
        }
        sVar8 = strlen(local_8f8);
        uVar7 = (uint)sVar8;
        uVar13 = sVar8 & 0xffffffff;
        uVar9 = (int)uVar7 >> 0x1f & uVar7;
        uVar12 = sVar8 & 0xffffffff;
        do {
          uVar13 = uVar13 - 1;
          uVar11 = (uint)uVar12;
          uVar12 = (ulong)(uVar9 - 1);
          uVar10 = uVar9;
          if ((int)uVar11 < 1) break;
          uVar12 = (ulong)(uVar11 - 1);
          uVar10 = uVar11;
        } while (local_8f8[uVar13 & 0xffffffff] != '.');
        if ((int)uVar10 <= (int)uVar7 && 1 < (int)uVar10) {
          memset(local_8f8 + uVar12,0,sVar8 - uVar12);
        }
        pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
        pcVar14 = strtimeex_fns();
        bVar3 = false;
        sprintf(local_138,"log/%.127s_%.64s.txt",local_8f8,pcVar14);
        pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
        local_7f8.pfSaveFile = (FILE *)fopen(local_138,"w");
        if ((FILE *)local_7f8.pfSaveFile == (FILE *)0x0) {
          puts("Unable to create RazorAHRS data file.");
          bVar3 = false;
          goto LAB_00155af6;
        }
      }
    }
    if ((bVar3) &&
       (local_9f0 = local_9f0 + 1, ExitOnErrorCount <= local_9f0 && 0 < ExitOnErrorCount)) {
      bExit = 1;
    }
    if (bExit != 0) {
LAB_00155af6:
      if (local_940 == 0) {
        clock_gettime(4,(timespec *)&local_a08);
        local_970 = local_a08.inf;
        dStack_968 = local_a08.sup;
        local_a08.inf =
             (double)(((long)local_a08.inf + (long)local_960 +
                      ((long)local_a08.sup + (long)dStack_958) / 1000000000) - local_980.tv_sec);
        local_a08.sup =
             (double)(((long)local_a08.sup + (long)dStack_958) % 1000000000 - local_980.tv_nsec);
        if ((long)local_a08.sup < 0) {
          local_a08.inf = (double)((long)local_a08.inf + (long)local_a08.sup / 1000000000 + -1);
          local_a08.sup = (double)((long)local_a08.sup % 1000000000 + 1000000000);
        }
        local_960 = local_a08.inf;
        dStack_958 = local_a08.sup;
      }
      if ((FILE *)local_7f8.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)local_7f8.pfSaveFile);
        local_7f8.pfSaveFile = (FILE *)0x0;
      }
      if (!bVar3) {
        iVar4 = CloseRS232Port(&local_7f8.RS232Port);
        if (iVar4 == 0) {
          __s = "RazorAHRS disconnected.";
        }
        puts(__s);
      }
      if (bExit == 0) {
        bExit = 1;
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

THREAD_PROC_RETURN_VALUE RazorAHRSThread(void* pParam)
{
	RAZORAHRS razorahrs;
	struct timeval tv;
	RAZORAHRSDATA razorahrsdata;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 50;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&razorahrs, 0, sizeof(RAZORAHRS));

	memset(&tv, 0, sizeof(tv));
	memset(&razorahrsdata, 0, sizeof(razorahrsdata));

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		mSleep(threadperiod);

		if (bPauseRazorAHRS) 
		{ 
			if (bConnected)
			{
				printf("RazorAHRS paused.\n");
				bConnected = FALSE;
				DisconnectRazorAHRS(&razorahrs);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartRazorAHRS) 
		{ 
			if (bConnected)
			{
				printf("Restarting a RazorAHRS.\n");
				bConnected = FALSE;
				DisconnectRazorAHRS(&razorahrs);
			}
			bRestartRazorAHRS = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectRazorAHRS(&razorahrs, "RazorAHRS0.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = razorahrs.threadperiod;

				memset(&tv, 0, sizeof(tv));
				memset(&razorahrsdata, 0, sizeof(razorahrsdata));

				if (razorahrs.pfSaveFile != NULL)
				{
					fclose(razorahrs.pfSaveFile); 
					razorahrs.pfSaveFile = NULL;
				}
				if ((razorahrs.bSaveRawData)&&(razorahrs.pfSaveFile == NULL)) 
				{
					if (strlen(razorahrs.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", razorahrs.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "razorahrs");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					razorahrs.pfSaveFile = fopen(szSaveFilePath, "w");
					if (razorahrs.pfSaveFile == NULL) 
					{
						printf("Unable to create RazorAHRS data file.\n");
						break;
					}
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			if (GetLatestDataRazorAHRS(&razorahrs, &razorahrsdata) == EXIT_SUCCESS)
			{
				if (gettimeofday(&tv, NULL) != EXIT_SUCCESS) { tv.tv_sec = 0; tv.tv_usec = 0; }

				EnterCriticalSection(&StateVariablesCS);

				phi_ahrs = fmod_2PI(razorahrsdata.Roll)+interval(-phi_ahrs_acc, phi_ahrs_acc);
				theta_ahrs = fmod_2PI(-razorahrsdata.Pitch)+interval(-theta_ahrs_acc, theta_ahrs_acc);
				psi_ahrs = fmod_2PI(M_PI/2.0-razorahrsdata.Yaw-angle_env)+interval(-psi_ahrs_acc, psi_ahrs_acc);

				if ((razorahrs.bROSMode)&&
					!((razorahrsdata.gyrx == 0)&&(razorahrsdata.gyry == 0)&&(razorahrsdata.gyrz == 0)&&
					(razorahrsdata.accx == 0)&&(razorahrsdata.accy == 0)&&(razorahrsdata.accz == 0)))
				{
					omegax_ahrs = razorahrsdata.gyrx+interval(-omegax_ahrs_acc, omegax_ahrs_acc);
					omegay_ahrs = -razorahrsdata.gyry+interval(-omegay_ahrs_acc, omegay_ahrs_acc);
					omegaz_ahrs = -razorahrsdata.gyrz+interval(-omegaz_ahrs_acc, omegaz_ahrs_acc);
					accrx_ahrs = razorahrsdata.accx*9.8/256.0+interval(-accrx_ahrs_acc, accrx_ahrs_acc);
					accry_ahrs = -razorahrsdata.accy*9.8/256.0+interval(-accry_ahrs_acc, accry_ahrs_acc);
					accrz_ahrs = -razorahrsdata.accz*9.8/256.0+interval(-accrz_ahrs_acc, accrz_ahrs_acc);
				}

				LeaveCriticalSection(&StateVariablesCS);
			}
			else
			{
				printf("Connection to a RazorAHRS lost.\n");
				bConnected = FALSE;
				DisconnectRazorAHRS(&razorahrs);
			}
		}

		//printf("RazorAHRSThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	if (razorahrs.pfSaveFile != NULL)
	{
		fclose(razorahrs.pfSaveFile); 
		razorahrs.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectRazorAHRS(&razorahrs);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}